

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

ExtPubkey * __thiscall
cfd::core::DescriptorKeyReference::GetExtPubkey
          (ExtPubkey *__return_storage_ptr__,DescriptorKeyReference *this)

{
  uint32_t uVar1;
  uint8_t uVar2;
  undefined3 uVar3;
  uint32_t uVar4;
  CfdException *this_00;
  undefined1 local_48 [32];
  
  if (this->key_type_ == kDescriptorKeyBip32Priv) {
    ExtPrivkey::GetExtPubkey(__return_storage_ptr__,&this->extprivkey_);
  }
  else {
    if (this->key_type_ != kDescriptorKeyBip32) {
      local_48._0_8_ = "cfdcore_descriptor.cpp";
      local_48._8_4_ = 0x1ac;
      local_48._16_8_ = "GetExtPubkey";
      logger::log<>((CfdSourceLocation *)local_48,kCfdLogLevelWarning,
                    "Failed to GetExtPubkey. unsupported key type.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_48._0_8_ = local_48 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"GetExtPubkey unsupported key type.","");
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_48);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extpubkey_);
    uVar1 = (this->extpubkey_).fingerprint_;
    uVar2 = (this->extpubkey_).depth_;
    uVar3 = *(undefined3 *)&(this->extpubkey_).field_0x21;
    uVar4 = (this->extpubkey_).child_num_;
    __return_storage_ptr__->version_ = (this->extpubkey_).version_;
    __return_storage_ptr__->fingerprint_ = uVar1;
    __return_storage_ptr__->depth_ = uVar2;
    *(undefined3 *)&__return_storage_ptr__->field_0x21 = uVar3;
    __return_storage_ptr__->child_num_ = uVar4;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&(__return_storage_ptr__->chaincode_).data_,&(this->extpubkey_).chaincode_.data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &__return_storage_ptr__->pubkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extpubkey_).pubkey_)
    ;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&(__return_storage_ptr__->tweak_sum_).data_,&(this->extpubkey_).tweak_sum_.data_);
  }
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey DescriptorKeyReference::GetExtPubkey() const {
  if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32) {
    return extpubkey_;
  }
  if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
    return extprivkey_.GetExtPubkey();
  }
  warn(CFD_LOG_SOURCE, "Failed to GetExtPubkey. unsupported key type.");
  throw CfdException(
      CfdError::kCfdIllegalArgumentError,
      "GetExtPubkey unsupported key type.");
}